

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void icetImageAdjustForOutput(IceTImage image)

{
  IceTBoolean IVar1;
  
  if (image.opaque_internals != (IceTVoid *)0x0) {
    IVar1 = icetIsEnabled(0x144);
    if ((IVar1 != '\0') && (*(int *)((long)image.opaque_internals + 4) != 0xc000)) {
      *(undefined4 *)((long)image.opaque_internals + 8) = 0xd000;
      icetImageSetDimensions
                (image,*(IceTSizeType *)((long)image.opaque_internals + 0xc),
                 *(IceTSizeType *)((long)image.opaque_internals + 0x10));
      return;
    }
  }
  return;
}

Assistant:

void icetImageAdjustForOutput(IceTImage image)
{
    IceTEnum color_format;

    if (icetImageIsNull(image)) return;

    ICET_TEST_IMAGE_HEADER(image);

    if (icetIsEnabled(ICET_COMPOSITE_ONE_BUFFER)) {
        color_format = icetImageGetColorFormat(image);
        if (color_format != ICET_IMAGE_COLOR_NONE) {
          /* Set to no depth information. */
            ICET_IMAGE_HEADER(image)[ICET_IMAGE_DEPTH_FORMAT_INDEX]
                = ICET_IMAGE_DEPTH_NONE;
          /* Reset the image size (changes actual buffer size). */
            icetImageSetDimensions(image,
                                   icetImageGetWidth(image),
                                   icetImageGetHeight(image));
        }
    }
}